

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpirvIntrinsics.cpp
# Opt level: O1

TSpirvRequirement * __thiscall
glslang::TParseContext::makeSpirvRequirement
          (TParseContext *this,TSourceLoc *loc,TString *name,TIntermAggregate *extensions,
          TIntermAggregate *capabilities)

{
  _Rb_tree_header *p_Var1;
  undefined8 *puVar2;
  long *plVar3;
  int iVar4;
  TPoolAllocator *pTVar5;
  TSpirvRequirement *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar6;
  undefined8 *puVar7;
  int local_3c;
  TSourceLoc *local_38;
  
  local_38 = loc;
  pTVar5 = GetThreadPoolAllocator();
  this_00 = (TSpirvRequirement *)TPoolAllocator::allocate(pTVar5,0x70);
  pTVar5 = GetThreadPoolAllocator();
  (this_00->extensions).
  super_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  ._M_t._M_impl.super__Node_allocator.allocator = pTVar5;
  p_Var1 = &(this_00->extensions).
            super_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
  (this_00->extensions).
  super_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this_00->extensions).
  super_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this_00->extensions).
  super_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this_00->extensions).
  super_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this_00->extensions).
  super_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pTVar5 = GetThreadPoolAllocator();
  (this_00->capabilities).super_set<int,_std::less<int>,_glslang::pool_allocator<int>_>._M_t._M_impl
  .super__Node_allocator.allocator = pTVar5;
  p_Var1 = &(this_00->capabilities).super_set<int,_std::less<int>,_glslang::pool_allocator<int>_>.
            _M_t._M_impl.super__Rb_tree_header;
  (this_00->capabilities).super_set<int,_std::less<int>,_glslang::pool_allocator<int>_>._M_t._M_impl
  .super__Rb_tree_header._M_header._M_color = _S_red;
  (this_00->capabilities).super_set<int,_std::less<int>,_glslang::pool_allocator<int>_>._M_t._M_impl
  .super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this_00->capabilities).super_set<int,_std::less<int>,_glslang::pool_allocator<int>_>._M_t._M_impl
  .super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this_00->capabilities).super_set<int,_std::less<int>,_glslang::pool_allocator<int>_>._M_t._M_impl
  .super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this_00->capabilities).super_set<int,_std::less<int>,_glslang::pool_allocator<int>_>._M_t._M_impl
  .super__Rb_tree_header._M_node_count = 0;
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(name,"extensions");
  if (iVar4 == 0) {
    if (extensions == (TIntermAggregate *)0x0) {
      __assert_fail("extensions",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/SpirvIntrinsics.cpp"
                    ,0x41,
                    "TSpirvRequirement *glslang::TParseContext::makeSpirvRequirement(const TSourceLoc &, const TString &, const TIntermAggregate *, const TIntermAggregate *)"
                   );
    }
    iVar4 = (*(extensions->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x33])(extensions);
    puVar2 = *(undefined8 **)(CONCAT44(extraout_var,iVar4) + 0x10);
    for (puVar7 = *(undefined8 **)(CONCAT44(extraout_var,iVar4) + 8); puVar7 != puVar2;
        puVar7 = puVar7 + 1) {
      plVar3 = (long *)*puVar7;
      lVar6 = (**(code **)(*plVar3 + 0x28))(plVar3);
      if (lVar6 == 0) {
        __assert_fail("extension->getAsConstantUnion()",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/SpirvIntrinsics.cpp"
                      ,0x43,
                      "TSpirvRequirement *glslang::TParseContext::makeSpirvRequirement(const TSourceLoc &, const TString &, const TIntermAggregate *, const TIntermAggregate *)"
                     );
      }
      lVar6 = (**(code **)(*plVar3 + 0x28))(plVar3);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::_Identity<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::less<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,glslang::pool_allocator<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>>
      ::
      _M_insert_unique<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const&>
                ((_Rb_tree<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::_Identity<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::less<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,glslang::pool_allocator<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>>
                  *)this_00,
                 (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 **(undefined8 **)(*(long *)(lVar6 + 0xc0) + 8));
    }
  }
  else {
    iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(name,"capabilities");
    if (iVar4 == 0) {
      if (capabilities == (TIntermAggregate *)0x0) {
        __assert_fail("capabilities",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/SpirvIntrinsics.cpp"
                      ,0x47,
                      "TSpirvRequirement *glslang::TParseContext::makeSpirvRequirement(const TSourceLoc &, const TString &, const TIntermAggregate *, const TIntermAggregate *)"
                     );
      }
      iVar4 = (*(capabilities->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x33])(capabilities);
      puVar7 = *(undefined8 **)(CONCAT44(extraout_var_00,iVar4) + 8);
      puVar2 = *(undefined8 **)(CONCAT44(extraout_var_00,iVar4) + 0x10);
      if (puVar7 != puVar2) {
        do {
          plVar3 = (long *)*puVar7;
          lVar6 = (**(code **)(*plVar3 + 0x28))(plVar3);
          if (lVar6 == 0) {
            __assert_fail("capability->getAsConstantUnion()",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/SpirvIntrinsics.cpp"
                          ,0x49,
                          "TSpirvRequirement *glslang::TParseContext::makeSpirvRequirement(const TSourceLoc &, const TString &, const TIntermAggregate *, const TIntermAggregate *)"
                         );
          }
          lVar6 = (**(code **)(*plVar3 + 0x28))(plVar3);
          local_3c = **(int **)(*(long *)(lVar6 + 0xc0) + 8);
          std::
          _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_glslang::pool_allocator<int>_>::
          _M_insert_unique<int>
                    ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_glslang::pool_allocator<int>_>
                      *)&this_00->capabilities,&local_3c);
          puVar7 = puVar7 + 1;
        } while (puVar7 != puVar2);
      }
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,local_38,"unknown SPIR-V requirement",(name->_M_dataplus)._M_p,"");
    }
  }
  return this_00;
}

Assistant:

TSpirvRequirement* TParseContext::makeSpirvRequirement(const TSourceLoc& loc, const TString& name,
                                                       const TIntermAggregate* extensions,
                                                       const TIntermAggregate* capabilities)
{
    TSpirvRequirement* spirvReq = new TSpirvRequirement;

    if (name == "extensions") {
        assert(extensions);
        for (auto extension : extensions->getSequence()) {
            assert(extension->getAsConstantUnion());
            spirvReq->extensions.insert(*extension->getAsConstantUnion()->getConstArray()[0].getSConst());
        }
    } else if (name == "capabilities") {
        assert(capabilities);
        for (auto capability : capabilities->getSequence()) {
            assert(capability->getAsConstantUnion());
            spirvReq->capabilities.insert(capability->getAsConstantUnion()->getConstArray()[0].getIConst());
        }
    } else
        error(loc, "unknown SPIR-V requirement", name.c_str(), "");

    return spirvReq;
}